

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::CollationIterator::nextCE32FromDiscontiguousContraction
          (CollationIterator *this,CollationData *d,UCharsTrie *suffixes,uint32_t ce32,
          int32_t lookAhead,UChar32 c,UErrorCode *errorCode)

{
  char16_t cVar1;
  short sVar2;
  ushort uVar3;
  char16_t *pcVar4;
  uint16_t uVar5;
  ushort uVar6;
  uint uVar7;
  int cp;
  UStringTrieResult UVar8;
  SkippedState *pSVar9;
  int iVar10;
  char16_t *pcVar11;
  size_t size;
  int32_t iVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ushort local_46;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  local_46 = Normalizer2Impl::getFCD16(d->nfcImpl,c);
  uVar7 = nextSkippedCodePoint(this,errorCode);
  if ((int)uVar7 < 0) {
    iVar12 = 1;
LAB_0022a47e:
    backwardNumSkipped(this,iVar12,errorCode);
    return ce32;
  }
  size = (size_t)uVar7;
  uVar5 = Normalizer2Impl::getFCD16(d->nfcImpl,uVar7);
  if (uVar5 < 0x100) {
    iVar12 = 2;
    goto LAB_0022a47e;
  }
  pSVar9 = this->skipped;
  if (pSVar9 == (SkippedState *)0x0) {
    pSVar9 = (SkippedState *)UMemory::operator_new((UMemory *)0xa8,size);
    if (pSVar9 == (SkippedState *)0x0) {
      this->skipped = (SkippedState *)0x0;
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      return 0;
    }
    (pSVar9->oldBuffer).super_Replaceable.super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_00487e70;
    (pSVar9->oldBuffer).fUnion.fStackFields.fLengthAndFlags = 2;
    (pSVar9->newBuffer).super_Replaceable.super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_00487e70;
    (pSVar9->newBuffer).fUnion.fStackFields.fLengthAndFlags = 2;
    pSVar9->pos = 0;
    pSVar9->skipLengthAtMatch = 0;
    (pSVar9->state).uchars = (char16_t *)0x0;
    this->skipped = pSVar9;
  }
  else if (0x1f < (ushort)(pSVar9->oldBuffer).fUnion.fStackFields.fLengthAndFlags) {
    if ((suffixes->uchars_ != (char16_t *)0x0) && (suffixes->uchars_ == (pSVar9->state).uchars)) {
      suffixes->pos_ = (pSVar9->state).pos;
      suffixes->remainingMatchLength_ = (pSVar9->state).remainingMatchLength;
    }
    goto LAB_0022a5d7;
  }
  uVar13 = *(undefined4 *)&suffixes->uchars_;
  uVar14 = *(undefined4 *)((long)&suffixes->uchars_ + 4);
  *(undefined4 *)&suffixes->pos_ = uVar13;
  *(undefined4 *)((long)&suffixes->pos_ + 4) = uVar14;
  suffixes->remainingMatchLength_ = -1;
  if (lookAhead < 2) {
    iVar12 = -1;
    uVar15 = uVar13;
    uVar16 = uVar14;
  }
  else {
    (*(this->super_UObject)._vptr_UObject[0xd])(this,(ulong)(lookAhead + 1),errorCode);
    iVar10 = (*(this->super_UObject)._vptr_UObject[6])(this,errorCode);
    UCharsTrie::firstForCodePoint(suffixes,iVar10);
    if (lookAhead != 2) {
      iVar10 = lookAhead + -2;
      do {
        cp = (*(this->super_UObject)._vptr_UObject[6])(this,errorCode);
        UCharsTrie::nextForCodePoint(suffixes,cp);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    (*(this->super_UObject)._vptr_UObject[0xc])(this,2,errorCode);
    pSVar9 = this->skipped;
    uVar13 = *(undefined4 *)&suffixes->uchars_;
    uVar14 = *(undefined4 *)((long)&suffixes->uchars_ + 4);
    iVar12 = suffixes->remainingMatchLength_;
    uVar15 = *(undefined4 *)&suffixes->pos_;
    uVar16 = *(undefined4 *)((long)&suffixes->pos_ + 4);
  }
  *(undefined4 *)&(pSVar9->state).uchars = uVar13;
  *(undefined4 *)((long)&(pSVar9->state).uchars + 4) = uVar14;
  *(undefined4 *)&(pSVar9->state).pos = uVar15;
  *(undefined4 *)((long)&(pSVar9->state).pos + 4) = uVar16;
  (pSVar9->state).remainingMatchLength = iVar12;
LAB_0022a5d7:
  SkippedState::setFirstSkipped(pSVar9,c);
  iVar12 = 2;
  do {
    if (((local_46 & 0xff) < uVar5 >> 8) &&
       (UVar8 = UCharsTrie::nextForCodePoint(suffixes,uVar7), 1 < (int)UVar8)) {
      pcVar4 = suffixes->pos_;
      pcVar11 = pcVar4 + 1;
      cVar1 = *pcVar4;
      if (cVar1 < L'\0') {
        ce32 = (ushort)cVar1 & 0x7fff;
        if (0x3fff < ce32) {
          if (ce32 == 0x7fff) {
            uVar7 = (uint)(ushort)pcVar4[1] << 0x10;
            pcVar11 = pcVar4 + 2;
          }
          else {
            uVar7 = ce32 * 0x10000 + 0xc0000000;
          }
          ce32 = (ushort)*pcVar11 | uVar7;
        }
      }
      else if ((ushort)cVar1 < 0x4040) {
        ce32 = ((ushort)cVar1 >> 6) - 1;
      }
      else if ((ushort)cVar1 < 0x7fc0) {
        ce32 = ((ushort)cVar1 & 0x7fc0) * 0x400 + (uint)(ushort)*pcVar11 + 0xfeff0000;
      }
      else {
        ce32 = CONCAT22(pcVar4[1],pcVar4[2]);
      }
      pSVar9 = this->skipped;
      sVar2 = (pSVar9->newBuffer).fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar10 = (pSVar9->newBuffer).fUnion.fFields.fLength;
      }
      else {
        iVar10 = (int)sVar2 >> 5;
      }
      pSVar9->skipLengthAtMatch = iVar10;
      if ((UVar8 & USTRINGTRIE_NO_VALUE) == USTRINGTRIE_NO_MATCH) {
        iVar12 = 0;
        break;
      }
      (pSVar9->state).uchars = suffixes->uchars_;
      (pSVar9->state).pos = pcVar4;
      (pSVar9->state).remainingMatchLength = suffixes->remainingMatchLength_;
      iVar12 = 0;
    }
    else {
      icu_63::UnicodeString::append(&this->skipped->newBuffer,uVar7);
      local_46 = uVar5;
      if ((suffixes->uchars_ != (char16_t *)0x0) &&
         (pSVar9 = this->skipped, suffixes->uchars_ == (pSVar9->state).uchars)) {
        suffixes->pos_ = (pSVar9->state).pos;
        suffixes->remainingMatchLength_ = (pSVar9->state).remainingMatchLength;
      }
    }
    uVar7 = nextSkippedCodePoint(this,errorCode);
    if ((int)uVar7 < 0) break;
    iVar12 = iVar12 + 1;
    uVar5 = Normalizer2Impl::getFCD16(d->nfcImpl,uVar7);
  } while (0xff < uVar5);
  backwardNumSkipped(this,iVar12,errorCode);
  pSVar9 = this->skipped;
  uVar3 = (pSVar9->oldBuffer).fUnion.fStackFields.fLengthAndFlags;
  icu_63::UnicodeString::doReplace
            (&pSVar9->oldBuffer,0,pSVar9->pos,&pSVar9->newBuffer,0,pSVar9->skipLengthAtMatch);
  pSVar9->pos = 0;
  if (0x1f < uVar3) {
    return ce32;
  }
  if (0x1f < (ushort)(this->skipped->oldBuffer).fUnion.fStackFields.fLengthAndFlags) {
    uVar7 = 0xffffffff;
    while( true ) {
      appendCEsFromCE32(this,d,uVar7,ce32,'\x01',errorCode);
      pSVar9 = this->skipped;
      uVar3 = (pSVar9->oldBuffer).fUnion.fStackFields.fLengthAndFlags;
      if ((short)uVar3 < 0) {
        iVar10 = (pSVar9->oldBuffer).fUnion.fFields.fLength;
      }
      else {
        iVar10 = (int)(short)uVar3 >> 5;
      }
      if (iVar10 <= pSVar9->pos) break;
      uVar7 = icu_63::UnicodeString::char32At(&pSVar9->oldBuffer,pSVar9->pos);
      pSVar9->pos = (pSVar9->pos - (uint)(uVar7 < 0x10000)) + 2;
      ce32 = (*(this->super_UObject)._vptr_UObject[0xe])(this,(ulong)uVar7);
      d = this->data;
      if (ce32 == 0xc0) {
        d = d->base;
        ce32 = CollationData::getCE32(d,uVar7);
      }
    }
    uVar6 = 2;
    if (((int)(short)uVar3 & 1U) == 0) {
      uVar6 = uVar3 & 0x1e;
    }
    (pSVar9->oldBuffer).fUnion.fStackFields.fLengthAndFlags = uVar6;
    pSVar9->pos = 0;
    return 1;
  }
  return ce32;
}

Assistant:

uint32_t
CollationIterator::nextCE32FromDiscontiguousContraction(
        const CollationData *d, UCharsTrie &suffixes, uint32_t ce32,
        int32_t lookAhead, UChar32 c,
        UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }

    // UCA section 3.3.2 Contractions:
    // Contractions that end with non-starter characters
    // are known as discontiguous contractions.
    // ... discontiguous contractions must be detected in input text
    // whenever the final sequence of non-starter characters could be rearranged
    // so as to make a contiguous matching sequence that is canonically equivalent.

    // UCA: http://www.unicode.org/reports/tr10/#S2.1
    // S2.1 Find the longest initial substring S at each point that has a match in the table.
    // S2.1.1 If there are any non-starters following S, process each non-starter C.
    // S2.1.2 If C is not blocked from S, find if S + C has a match in the table.
    //     Note: A non-starter in a string is called blocked
    //     if there is another non-starter of the same canonical combining class or zero
    //     between it and the last character of canonical combining class 0.
    // S2.1.3 If there is a match, replace S by S + C, and remove C.

    // First: Is a discontiguous contraction even possible?
    uint16_t fcd16 = d->getFCD16(c);
    U_ASSERT(fcd16 > 0xff);  // The caller checked this already, as a shortcut.
    UChar32 nextCp = nextSkippedCodePoint(errorCode);
    if(nextCp < 0) {
        // No further text.
        backwardNumSkipped(1, errorCode);
        return ce32;
    }
    ++lookAhead;
    uint8_t prevCC = (uint8_t)fcd16;
    fcd16 = d->getFCD16(nextCp);
    if(fcd16 <= 0xff) {
        // The next code point after c is a starter (S2.1.1 "process each non-starter").
        backwardNumSkipped(2, errorCode);
        return ce32;
    }

    // We have read and matched (lookAhead-2) code points,
    // read non-matching c and peeked ahead at nextCp.
    // Return to the state before the mismatch and continue matching with nextCp.
    if(skipped == NULL || skipped->isEmpty()) {
        if(skipped == NULL) {
            skipped = new SkippedState();
            if(skipped == NULL) {
                errorCode = U_MEMORY_ALLOCATION_ERROR;
                return 0;
            }
        }
        suffixes.reset();
        if(lookAhead > 2) {
            // Replay the partial match so far.
            backwardNumCodePoints(lookAhead, errorCode);
            suffixes.firstForCodePoint(nextCodePoint(errorCode));
            for(int32_t i = 3; i < lookAhead; ++i) {
                suffixes.nextForCodePoint(nextCodePoint(errorCode));
            }
            // Skip c (which did not match) and nextCp (which we will try now).
            forwardNumCodePoints(2, errorCode);
        }
        skipped->saveTrieState(suffixes);
    } else {
        // Reset to the trie state before the failed match of c.
        skipped->resetToTrieState(suffixes);
    }

    skipped->setFirstSkipped(c);
    // Number of code points read since the last match (at this point: c and nextCp).
    int32_t sinceMatch = 2;
    c = nextCp;
    for(;;) {
        UStringTrieResult match;
        // "If C is not blocked from S, find if S + C has a match in the table." (S2.1.2)
        if(prevCC < (fcd16 >> 8) && USTRINGTRIE_HAS_VALUE(match = suffixes.nextForCodePoint(c))) {
            // "If there is a match, replace S by S + C, and remove C." (S2.1.3)
            // Keep prevCC unchanged.
            ce32 = (uint32_t)suffixes.getValue();
            sinceMatch = 0;
            skipped->recordMatch();
            if(!USTRINGTRIE_HAS_NEXT(match)) { break; }
            skipped->saveTrieState(suffixes);
        } else {
            // No match for "S + C", skip C.
            skipped->skip(c);
            skipped->resetToTrieState(suffixes);
            prevCC = (uint8_t)fcd16;
        }
        if((c = nextSkippedCodePoint(errorCode)) < 0) { break; }
        ++sinceMatch;
        fcd16 = d->getFCD16(c);
        if(fcd16 <= 0xff) {
            // The next code point after c is a starter (S2.1.1 "process each non-starter").
            break;
        }
    }
    backwardNumSkipped(sinceMatch, errorCode);
    UBool isTopDiscontiguous = skipped->isEmpty();
    skipped->replaceMatch();
    if(isTopDiscontiguous && !skipped->isEmpty()) {
        // We did get a match after skipping one or more combining marks,
        // and we are not in a recursive discontiguous contraction.
        // Append CEs from the contraction ce32
        // and then from the combining marks that we skipped before the match.
        c = U_SENTINEL;
        for(;;) {
            appendCEsFromCE32(d, c, ce32, TRUE, errorCode);
            // Fetch CE32s for skipped combining marks from the normal data, with fallback,
            // rather than from the CollationData where we found the contraction.
            if(!skipped->hasNext()) { break; }
            c = skipped->next();
            ce32 = getDataCE32(c);
            if(ce32 == Collation::FALLBACK_CE32) {
                d = data->base;
                ce32 = d->getCE32(c);
            } else {
                d = data;
            }
            // Note: A nested discontiguous-contraction match
            // replaces consumed combining marks with newly skipped ones
            // and resets the reading position to the beginning.
        }
        skipped->clear();
        ce32 = Collation::NO_CE32;  // Signal to the caller that the result is in the ceBuffer.
    }
    return ce32;
}